

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

bool __thiscall graphics101::Mesh::loadFromOBJ(Mesh *this,string *path)

{
  pointer *ppvVar1;
  pointer *ppvVar2;
  iterator iVar3;
  iterator __position;
  pointer pTVar4;
  pointer pTVar5;
  vec<2,_float,_(glm::qualifier)0> vVar6;
  undefined1 __nptr [8];
  char *pcVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  istream *piVar12;
  int *piVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int *piVar19;
  int iVar20;
  uint uVar21;
  int *piVar22;
  string *this_00;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  string b;
  real z;
  string vt_str;
  string vn_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fb;
  string line;
  string first_word;
  istringstream linestream;
  ifstream mesh;
  undefined1 local_500 [8];
  size_type local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  int local_4dc;
  int *local_4d8;
  Mesh *local_4d0;
  int *local_4c8;
  int local_4bc;
  int *local_4b8;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_4b0;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_4ac;
  undefined1 local_4a0 [16];
  char *local_490;
  long local_488;
  char local_480 [16];
  char *local_470;
  long local_468;
  char local_460 [16];
  int *local_450;
  int *local_448;
  uint local_43c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  undefined1 *local_420;
  long local_418;
  undefined1 local_410 [16];
  undefined1 *local_400;
  undefined8 local_3f8;
  undefined1 local_3f0 [16];
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
  *local_3e0;
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
  *local_3d8;
  vector<graphics101::Triangle,std::allocator<graphics101::Triangle>> *local_3d0;
  vector<graphics101::Triangle,std::allocator<graphics101::Triangle>> *local_3c8;
  vector<graphics101::Triangle,std::allocator<graphics101::Triangle>> *local_3c0;
  istringstream local_3b8 [120];
  ios_base local_340 [264];
  long local_238 [4];
  uint auStack_218 [122];
  
  clear(this);
  std::ifstream::ifstream(local_238,(string *)path,_S_in);
  uVar21 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((uVar21 & 5) == 0) {
    local_3c8 = (vector<graphics101::Triangle,std::allocator<graphics101::Triangle>> *)
                &this->face_normals;
    local_3d0 = (vector<graphics101::Triangle,std::allocator<graphics101::Triangle>> *)
                &this->face_texcoords;
    local_3c0 = (vector<graphics101::Triangle,std::allocator<graphics101::Triangle>> *)
                &this->face_positions;
    local_3e0 = (vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                 *)&this->texcoords;
    local_3d8 = (vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                 *)&this->normals;
    local_4dc = 0;
    local_43c = uVar21;
    while( true ) {
      piVar12 = std::ws<char,std::char_traits<char>>((istream *)local_238);
      uVar21 = local_43c;
      if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 2) != 0) break;
      local_418 = 0;
      local_410[0] = 0;
      local_420 = local_410;
      cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_420,cVar8);
      if (local_418 != 0) {
        std::__cxx11::istringstream::istringstream(local_3b8,(string *)&local_420,_S_in);
        local_3f8 = 0;
        local_3f0[0] = 0;
        local_400 = local_3f0;
        std::operator>>((istream *)local_3b8,(string *)&local_400);
        iVar9 = std::__cxx11::string::compare((char *)&local_400);
        if (iVar9 == 0) {
          piVar12 = std::istream::_M_extract<float>((float *)local_3b8);
          piVar12 = std::istream::_M_extract<float>((float *)piVar12);
          std::istream::_M_extract<float>((float *)piVar12);
          local_500._4_4_ = local_470._0_4_;
          local_500._0_4_ = SUB84(local_490,0);
          local_4f8 = CONCAT44(local_4f8._4_4_,local_4b0);
          iVar3._M_current =
               (this->positions).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->positions).
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)this,iVar3,(vec<3,_float,_(glm::qualifier)0> *)local_500);
          }
          else {
            (iVar3._M_current)->field_2 =
                 (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_4b0;
            (iVar3._M_current)->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)SUB84(local_490,0);
            (iVar3._M_current)->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_470._0_4_;
            ppvVar1 = &(this->positions).
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppvVar1 = *ppvVar1 + 1;
          }
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)&local_400);
          if (iVar9 == 0) {
            piVar12 = std::istream::_M_extract<float>((float *)local_3b8);
            piVar12 = std::istream::_M_extract<float>((float *)piVar12);
            std::istream::_M_extract<float>((float *)piVar12);
            local_500._4_4_ = local_470._0_4_;
            local_500._0_4_ = SUB84(local_490,0);
            local_4f8 = CONCAT44(local_4f8._4_4_,local_4b0);
            iVar3._M_current =
                 (this->normals).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->normals).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                        (local_3d8,iVar3,(vec<3,_float,_(glm::qualifier)0> *)local_500);
            }
            else {
              (iVar3._M_current)->field_2 =
                   (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_4b0;
              (iVar3._M_current)->field_0 =
                   (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                   SUB84(local_490,0);
              (iVar3._M_current)->field_1 =
                   (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_470._0_4_;
              ppvVar1 = &(this->normals).
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppvVar1 = *ppvVar1 + 1;
            }
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)&local_400);
            if (iVar9 == 0) {
              piVar12 = std::istream::_M_extract<float>((float *)local_3b8);
              std::istream::_M_extract<float>((float *)piVar12);
              local_500._4_4_ = local_470._0_4_;
              local_500._0_4_ = SUB84(local_490,0);
              __position._M_current =
                   (this->texcoords).
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->texcoords).
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
                          (local_3e0,__position,(vec<2,_float,_(glm::qualifier)0> *)local_500);
              }
              else {
                *__position._M_current = (vec<2,_float,_(glm::qualifier)0>)local_500;
                ppvVar2 = &(this->texcoords).
                           super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppvVar2 = *ppvVar2 + 1;
              }
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)&local_400);
              if (iVar9 == 0) {
                local_438.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_438.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_438.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::reserve(&local_438,4);
                while( true ) {
                  piVar12 = std::ws<char,std::char_traits<char>>((istream *)local_3b8);
                  if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 2) != 0) break;
                  local_4f8 = 0;
                  local_4f0._M_local_buf[0] = '\0';
                  local_500 = (undefined1  [8])&local_4f0;
                  std::operator>>((istream *)local_3b8,(string *)local_500);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_438,(value_type *)local_500);
                  if (local_500 != (undefined1  [8])&local_4f0) {
                    operator_delete((void *)local_500);
                  }
                }
                piVar22 = (int *)((long)local_438.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_438.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5);
                if (piVar22 < (int *)0x3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "ERROR: Skipping a face with less than 3 vertices.\n",0x32);
                }
                else {
                  if ((int *)0xaaaaaaaaaaaaaaa < piVar22) {
LAB_0011d50a:
                    std::__throw_length_error("vector::_M_default_append");
                  }
                  local_4d8 = (int *)0x0;
                  local_4d0 = this;
                  piVar13 = (int *)operator_new((long)piVar22 * 0xc);
                  local_4d8 = piVar13;
                  local_4c8 = piVar13;
                  memset(piVar13,0,(long)piVar22 * 0xc);
                  piVar13 = piVar13 + 2;
                  piVar14 = (int *)0x0;
                  local_450 = piVar22;
                  do {
                    local_500 = (undefined1  [8])&local_4f0;
                    uVar18 = (long)&((local_438.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + (long)piVar14;
                    local_4f8 = 0;
                    local_4f0._M_local_buf[0] = '\0';
                    local_490 = local_480;
                    local_488 = 0;
                    local_480[0] = '\0';
                    local_470 = local_460;
                    local_468 = 0;
                    local_460[0] = '\0';
                    local_4b8 = piVar22;
                    local_448 = piVar14;
                    lVar15 = std::__cxx11::string::find((char)uVar18,0x2f);
                    std::__cxx11::string::substr((ulong)&local_4b0,uVar18);
                    std::__cxx11::string::operator=((string *)local_500,(string *)&local_4b0);
                    if ((undefined1 *)CONCAT44(aStack_4ac,local_4b0) != local_4a0) {
                      operator_delete((undefined1 *)CONCAT44(aStack_4ac,local_4b0));
                    }
                    if (lVar15 != -1) {
                      lVar15 = std::__cxx11::string::find((char)uVar18,0x2f);
                      if (lVar15 == -1) {
                        std::__cxx11::string::substr((ulong)&local_4b0,uVar18);
                        this_00 = (string *)&local_490;
                      }
                      else {
                        std::__cxx11::string::substr((ulong)&local_4b0,uVar18);
                        std::__cxx11::string::operator=((string *)&local_490,(string *)&local_4b0);
                        if ((undefined1 *)CONCAT44(aStack_4ac,local_4b0) != local_4a0) {
                          operator_delete((undefined1 *)CONCAT44(aStack_4ac,local_4b0));
                        }
                        std::__cxx11::string::substr((ulong)&local_4b0,uVar18);
                        this_00 = (string *)&local_470;
                      }
                      std::__cxx11::string::operator=(this_00,(string *)&local_4b0);
                      if ((undefined1 *)CONCAT44(aStack_4ac,local_4b0) != local_4a0) {
                        operator_delete((undefined1 *)CONCAT44(aStack_4ac,local_4b0));
                      }
                    }
                    __nptr = local_500;
                    iVar9 = 0;
                    lVar15 = 0;
                    if (local_4f8 != 0) {
                      piVar22 = __errno_location();
                      iVar20 = *piVar22;
                      *piVar22 = 0;
                      lVar15 = strtol((char *)__nptr,(char **)&local_4b0,10);
                      vVar6.field_1 = aStack_4ac;
                      vVar6.field_0 = local_4b0;
                      if (vVar6 == (vec<2,_float,_(glm::qualifier)0>)__nptr) {
                        std::__throw_invalid_argument("stoi");
LAB_0011d4ce:
                        std::__throw_out_of_range("stoi");
LAB_0011d4da:
                        std::__throw_invalid_argument("stoi");
LAB_0011d4e6:
                        std::__throw_invalid_argument("stoi");
                      }
                      else if ((0xfffffffeffffffff < lVar15 - 0x80000000U) && (*piVar22 != 0x22)) {
                        if (*piVar22 == 0) {
                          *piVar22 = iVar20;
                        }
                        goto LAB_0011cf29;
                      }
                      std::__throw_out_of_range("stoi");
LAB_0011d4fe:
                      std::__throw_out_of_range("stoi");
                      goto LAB_0011d50a;
                    }
LAB_0011cf29:
                    pcVar7 = local_490;
                    if (local_488 != 0) {
                      piVar22 = __errno_location();
                      iVar20 = *piVar22;
                      *piVar22 = 0;
                      lVar16 = strtol(pcVar7,(char **)&local_4b0,10);
                      if ((char *)CONCAT44(aStack_4ac,local_4b0) == pcVar7) goto LAB_0011d4da;
                      iVar9 = (int)lVar16;
                      if ((lVar16 - 0x80000000U < 0xffffffff00000000) || (*piVar22 == 0x22))
                      goto LAB_0011d4ce;
                      if (*piVar22 == 0) {
                        *piVar22 = iVar20;
                      }
                    }
                    pcVar7 = local_470;
                    if (local_468 == 0) {
                      lVar16 = 0;
                    }
                    else {
                      piVar22 = __errno_location();
                      local_4bc = *piVar22;
                      *piVar22 = 0;
                      lVar16 = strtol(pcVar7,(char **)&local_4b0,10);
                      if ((char *)CONCAT44(aStack_4ac,local_4b0) == pcVar7) goto LAB_0011d4e6;
                      if ((lVar16 - 0x80000000U < 0xffffffff00000000) || (*piVar22 == 0x22))
                      goto LAB_0011d4fe;
                      if (*piVar22 == 0) {
                        *piVar22 = local_4bc;
                      }
                    }
                    if (local_470 != local_460) {
                      operator_delete(local_470);
                    }
                    if (local_490 != local_480) {
                      operator_delete(local_490);
                    }
                    if (local_500 != (undefined1  [8])&local_4f0) {
                      operator_delete((void *)local_500);
                    }
                    piVar19 = local_450;
                    iVar20 = (int)lVar15;
                    piVar13[-2] = iVar20;
                    piVar13[-1] = iVar9;
                    iVar9 = (int)lVar16;
                    *piVar13 = iVar9;
                    if (iVar20 == 0) {
                      __assert_fail("vb[i].v != 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                    ,0xd9,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    iVar10 = -1;
                    iVar17 = -1;
                    if (iVar20 < 0) {
                      iVar17 = (int)((ulong)((long)(local_4d0->positions).
                                                                                                      
                                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(local_4d0->positions).
                                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                               -0x55555555;
                    }
                    piVar13[-2] = iVar20 + iVar17;
                    iVar20 = (int)((ulong)((long)(local_4d0->texcoords).
                                                 super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(local_4d0->texcoords).
                                                super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
                    if (-1 < piVar13[-1]) {
                      iVar20 = -1;
                    }
                    piVar13[-1] = iVar20 + piVar13[-1];
                    if (iVar9 < 0) {
                      iVar10 = (int)((ulong)((long)(local_4d0->normals).
                                                                                                      
                                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(local_4d0->normals).
                                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                               -0x55555555;
                    }
                    *piVar13 = iVar9 + iVar10;
                    piVar13 = piVar13 + 3;
                    piVar14 = local_448 + 8;
                    piVar22 = (int *)((long)local_4b8 - 1);
                  } while (piVar22 != (int *)0x0);
                  pTVar4 = (local_4d0->face_normals).
                           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  pTVar5 = (local_4d0->face_normals).
                           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((pTVar4 != pTVar5) &&
                     ((long)pTVar4 - (long)pTVar5 !=
                      (long)(local_4d0->face_positions).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_4d0->face_positions).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
                    __assert_fail("face_normals.size() == 0 || face_normals.size() == face_positions.size()"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                  ,0xe4,"bool graphics101::Mesh::loadFromOBJ(const std::string &)");
                  }
                  pTVar4 = (local_4d0->face_texcoords).
                           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  pTVar5 = (local_4d0->face_texcoords).
                           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((pTVar4 != pTVar5) &&
                     ((long)pTVar4 - (long)pTVar5 !=
                      (long)(local_4d0->face_positions).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_4d0->face_positions).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
                    __assert_fail("face_texcoords.size() == 0 || face_texcoords.size() == face_positions.size()"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                  ,0xe5,"bool graphics101::Mesh::loadFromOBJ(const std::string &)");
                  }
                  if (local_450 != (int *)0x3) {
                    if (local_450 == (int *)0x4) {
                      local_4dc = local_4dc + 1;
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Triangulating a face with ",0x1a);
                      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11," vertices.\n",0xb)
                      ;
                    }
                  }
                  local_448 = local_4c8 + 2;
                  if (piVar19 < (int *)0x4) {
                    piVar19 = (int *)0x3;
                  }
                  local_4b8 = local_4c8 + 1;
                  local_450 = (int *)((long)piVar19 - 2);
                  lVar15 = 0x1c;
                  lVar25 = 0x20;
                  lVar23 = 0x18;
                  lVar24 = 0x10;
                  lVar26 = 0x14;
                  lVar16 = 0xc;
                  do {
                    std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>::
                    emplace_back<int&,int&,int&>
                              (local_3c0,local_4d8,(int *)((long)local_4c8 + lVar16),
                               (int *)((long)local_4c8 + lVar23));
                    iVar9 = local_4d8[2];
                    if ((*(int *)((long)local_4d8 + lVar25 + -0xc) != -1) == (iVar9 == -1)) {
                      __assert_fail("( vb[0].vn == -1 ) == ( vb[i-1].vn == -1 )",
                                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                    ,0xf7,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    if ((*(int *)((long)local_4d8 + lVar25) != -1) == (iVar9 == -1)) {
                      __assert_fail("( vb[0].vn == -1 ) == ( vb[i].vn == -1 )",
                                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                    ,0xf8,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    if ((*(int *)((long)local_4d8 + lVar25 + -0x10) != -1) == (local_4d8[1] == -1))
                    {
                      __assert_fail("( vb[0].vt == -1 ) == ( vb[i-1].vt == -1 )",
                                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                    ,0xf9,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    if ((*(int *)((long)local_4d8 + lVar25 + -4) != -1) == (local_4d8[1] == -1)) {
                      __assert_fail("( vb[0].vt == -1 ) == ( vb[i].vt == -1 )",
                                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                    ,0xfa,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    if (iVar9 != -1) {
                      std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>::
                      emplace_back<int&,int&,int&>
                                (local_3c8,local_448,(int *)((long)local_4c8 + lVar26),
                                 (int *)((long)local_4c8 + lVar25));
                    }
                    if (*local_4b8 != -1) {
                      std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>::
                      emplace_back<int&,int&,int&>
                                (local_3d0,local_4b8,(int *)((long)local_4c8 + lVar24),
                                 (int *)((long)local_4c8 + lVar15));
                    }
                    lVar15 = lVar15 + 0xc;
                    lVar25 = lVar25 + 0xc;
                    lVar23 = lVar23 + 0xc;
                    lVar24 = lVar24 + 0xc;
                    lVar26 = lVar26 + 0xc;
                    lVar16 = lVar16 + 0xc;
                    local_450 = (int *)((long)local_450 - 1);
                  } while (local_450 != (int *)0x0);
                  operator_delete(local_4d8);
                  this = local_4d0;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_438);
              }
            }
          }
        }
        if (local_400 != local_3f0) {
          operator_delete(local_400);
        }
        std::__cxx11::istringstream::~istringstream(local_3b8);
        std::ios_base::~ios_base(local_340);
      }
      if (local_420 != local_410) {
        operator_delete(local_420);
      }
    }
    if (0 < local_4dc) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Triangulated ",0xd);
      poVar11 = (ostream *)std::ostream::operator<<(&std::cerr,local_4dc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," quadrilaterals.\n",0x11);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: Unable to access path: ",0x1e);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(path->_M_dataplus)._M_p,path->_M_string_length);
    local_3b8[0] = (istringstream)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3b8,1);
  }
  std::ifstream::~ifstream(local_238);
  return (uVar21 & 5) == 0;
}

Assistant:

bool Mesh::loadFromOBJ( const std::string& path ) {
    using namespace std;
    
    clear();
    
    // TODO: Error checking with a printout to std::cerr and return false.
    
    // Print the number of quads triangulated only once. Keep track of the count.
    int num_quads_triangulated = 0;
    
    // Open the file.
    ifstream mesh( path );
    if( !mesh ) {
        cerr << "ERROR: Unable to access path: " << path << '\n';
        return false;
    }
    while( !( mesh >> ws ).eof() ) {
        // Get each line.
        string line;
        getline( mesh, line );
        
        // Skip blank lines.
        if( line.empty() ) continue;
        
        istringstream linestream( line );
        
        // Get the first word.
        string first_word;
        linestream >> first_word;
        
        if( first_word == "v" ) {
            real x,y,z;
            linestream >> x >> y >> z;
            positions.push_back( vec3( x,y,z ) );
        }
        else if( first_word == "vn" ) {
            real x,y,z;
            linestream >> x >> y >> z;
            normals.push_back( vec3( x,y,z ) );
        }
        else if( first_word == "vt" ) {
            real x,y;
            linestream >> x >> y;
            texcoords.push_back( vec2( x,y ) );
        }
        else if( first_word == "f" ) {
            std::vector< string > fb;
            fb.reserve( 4 );
            while( !( linestream >> ws ).eof() ) {
                string b;
                linestream >> b;
                fb.push_back( b );
            }
            if( fb.size() < 3 ) {
                cerr << "ERROR: Skipping a face with less than 3 vertices.\n";
                continue;
            }
            
            // OBJ files are 1-indexed
            // Negative indices subtract.
            
            std::vector< VertexBundle > vb;
            vb.resize( fb.size() );
            for( int i = 0; i < vb.size(); ++i ) {
                // Convert the string separated by slashes to integers.
                vb[i] = VertexBundle( fb[i] );
                
                // We must have positions, so they can't be zero.
                assert( vb[i].v != 0 );
                
                // If any index is negative, add it to that attribute's length.
                // Otherwise, subtract 1.
                if( vb[i].v  < 0 ) vb[i].v  += positions.size(); else vb[i].v  -= 1;
                if( vb[i].vt < 0 ) vb[i].vt += texcoords.size(); else vb[i].vt -= 1;
                if( vb[i].vn < 0 ) vb[i].vn += normals.size();   else vb[i].vn -= 1;
            }
            
            // We either have no normals/texcoords or we have normal/texcoord faces
            // in correspondence with position faces.
            assert( face_normals.size() == 0 || face_normals.size() == face_positions.size() );
            assert( face_texcoords.size() == 0 || face_texcoords.size() == face_positions.size() );
            
            // Add all the faces.
            if( vb.size() != 3 ) {
                if( vb.size() == 4 ) {
                    num_quads_triangulated += 1;
                } else {
                    cerr << "Triangulating a face with " << vb.size() << " vertices.\n";
                }
            }
            for( int i = 2; i < vb.size(); ++i ) {
                // Add the position face.
                face_positions.emplace_back( vb[0].v, vb[i-1].v, vb[i].v );
                
                // If one vertex bundle has normals or texcoords,
                // they all must have normals/texcoords.
                // We have already converted the OBJ coordinates back to 0-indexing,
                // so check for -1.
                assert( ( vb[0].vn == -1 ) == ( vb[i-1].vn == -1 ) );
                assert( ( vb[0].vn == -1 ) == ( vb[i].vn == -1 ) );
                assert( ( vb[0].vt == -1 ) == ( vb[i-1].vt == -1 ) );
                assert( ( vb[0].vt == -1 ) == ( vb[i].vt == -1 ) );
                
                if( vb[0].vn != -1 ) {
                    face_normals.emplace_back( vb[0].vn, vb[i-1].vn, vb[i].vn );
                }
                
                if( vb[0].vt != -1 ) {
                    face_texcoords.emplace_back( vb[0].vt, vb[i-1].vt, vb[i].vt );
                }
            }
        }
    }
    
    if( num_quads_triangulated > 0 ) {
        cerr << "Triangulated " << num_quads_triangulated << " quadrilaterals.\n";
    }
    
    return true;
}